

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_history.c
# Opt level: O0

nsh_status_t nsh_history_get_entry(nsh_history_t *hist,uint age,char *entry)

{
  uint uVar1;
  uint local_30;
  uint entry_index;
  uint most_recent_entry;
  char *entry_local;
  uint age_local;
  nsh_history_t *hist_local;
  
  uVar1 = nsh_history_entry_count(hist);
  if (age < uVar1) {
    local_30 = (hist->head - 1) - age;
    if (0x10 < local_30) {
      local_30 = local_30 + 0x10;
    }
    strncpy(entry,hist->entries[local_30],0x80);
    hist_local._4_4_ = NSH_STATUS_OK;
  }
  else {
    hist_local._4_4_ = NSH_STATUS_WRONG_ARG;
  }
  return hist_local._4_4_;
}

Assistant:

nsh_status_t nsh_history_get_entry(nsh_history_t* hist, unsigned int age, char* entry)
{
    if (age >= nsh_history_entry_count(hist)) {
        return NSH_STATUS_WRONG_ARG;
    }

    unsigned int most_recent_entry = hist->head - 1; // head points to the element just after the most recent entry
    unsigned int entry_index = most_recent_entry - age;
    if (entry_index > NSH_CMD_HISTORY_SIZE) {
        entry_index += NSH_CMD_HISTORY_SIZE;
    }

    strncpy(entry, hist->entries[entry_index], NSH_LINE_BUFFER_SIZE);

    return NSH_STATUS_OK;
}